

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string-to-double.cc
# Opt level: O1

double double_conversion::RadixStringToIeee<4,unsigned_short_const*>
                 (unsigned_short **current,unsigned_short *end,bool sign,uc16 separator,
                 bool parse_as_hex_float,bool allow_trailing_junk,double junk_string_value,
                 bool read_as_double,bool *result_is_junk)

{
  ushort uVar1;
  int iVar2;
  uint uVar3;
  bool bVar4;
  bool bVar5;
  uint uVar6;
  ulong uVar7;
  undefined7 extraout_var;
  undefined7 extraout_var_00;
  byte bVar8;
  ulong uVar9;
  uint uVar10;
  uint uVar11;
  undefined7 in_register_00000011;
  Double *extraout_RDX;
  byte bVar12;
  Double *pDVar13;
  Double *this;
  undefined3 in_register_00000089;
  int iVar14;
  char cVar15;
  ushort *puVar16;
  double dVar17;
  DiyFp diy_fp;
  unsigned_short *local_a8;
  undefined4 local_a0;
  undefined4 local_9c;
  double local_98;
  ushort *local_80;
  ulong local_78;
  Double *local_70;
  ulong local_68;
  uint local_5c;
  unsigned_short **local_58;
  undefined8 local_50;
  ulong local_48;
  long local_40;
  undefined8 local_38;
  
  local_9c = CONCAT31(in_register_00000089,allow_trailing_junk);
  *result_is_junk = true;
  local_a8 = end;
  local_98 = junk_string_value;
  local_80 = end;
  while (**current == 0x30) {
    bVar4 = Advance<unsigned_short_const*>(current,separator,0x10,&local_a8);
    if (bVar4) {
      *result_is_junk = false;
      if (sign) {
        return -0.0;
      }
      return 0.0;
    }
  }
  local_a0 = (undefined4)CONCAT71(in_register_00000011,sign);
  local_38 = 0x18;
  if (read_as_double) {
    local_38 = 0x35;
  }
  local_48 = 1L << (sbyte)local_38;
  cVar15 = (char)local_9c;
  local_78 = 0;
  local_50 = 5;
  local_40 = 4;
  puVar16 = *current;
  uVar1 = *puVar16;
  iVar14 = -0x30;
  local_58 = current;
  if (((uVar1 - 0x30 < 10) || (iVar14 = -0x57, (ushort)(uVar1 - 0x61) < 6)) ||
     (iVar14 = -0x37, (ushort)(uVar1 - 0x41) < 6)) {
    pDVar13 = (Double *)((long)iVar14 + (ulong)uVar1);
    uVar7 = (long)pDVar13 >> (sbyte)local_38;
    if ((int)uVar7 == 0) {
      bVar4 = Advance<unsigned_short_const*>(current,separator,0x10,&local_a8);
      uVar6 = (uint)bVar4 + (uint)bVar4 * 4;
      goto LAB_004b4275;
    }
    iVar14 = 1;
    if (1 < (int)uVar7) {
      uVar9 = uVar7 & 0xffffffff;
      do {
        iVar14 = iVar14 + 1;
        uVar9 = uVar9 >> 1;
        uVar6 = (uint)uVar7;
        uVar7 = uVar9;
      } while (3 < uVar6);
    }
    bVar8 = (byte)iVar14;
    local_5c = -1 << (bVar8 & 0x1f);
    local_68 = (long)pDVar13 >> (bVar8 & 0x3f);
    local_70 = pDVar13;
    bVar4 = Advance<unsigned_short_const*>(current,separator,0x10,&local_a8);
    bVar12 = 1;
    while (!bVar4) {
      if ((parse_as_hex_float) && (**current == 0x2e)) {
        Advance<unsigned_short_const*>(current,separator,0x10,&local_a8);
        local_78 = CONCAT71(extraout_var,1);
      }
      uVar1 = **current;
      if ((0x3f < uVar1 || 9 < uVar1 - 0x30) &&
         ((0x25 < uVar1 - 0x41 || ((0x3f0000003fU >> ((ulong)(uVar1 - 0x41) & 0x3f) & 1) == 0))))
      break;
      bVar12 = bVar12 & uVar1 == 0x30;
      iVar2 = iVar14 + 4;
      if ((local_78 & 1) != 0) {
        iVar2 = iVar14;
      }
      bVar4 = Advance<unsigned_short_const*>(current,separator,0x10,&local_a8);
      iVar14 = iVar2;
    }
    if (!parse_as_hex_float && cVar15 == '\0') {
      puVar16 = *current;
      bVar4 = puVar16 != local_80;
      if ((bVar4) && (bVar5 = isWhitespace((uint)*puVar16), bVar5)) {
        do {
          puVar16 = puVar16 + 1;
          bVar4 = puVar16 != local_80;
          if (puVar16 == local_80) break;
          bVar5 = isWhitespace((uint)*puVar16);
        } while (bVar5);
        *local_58 = puVar16;
        current = local_58;
      }
      uVar6 = 1;
      if (bVar4) goto LAB_004b4275;
    }
    uVar10 = (uint)local_70 & ~local_5c;
    pDVar13 = (Double *)(ulong)uVar10;
    uVar6 = 1 << (bVar8 - 1 & 0x1f);
    if ((int)uVar6 < (int)uVar10) {
      bVar4 = (local_48 & local_68 + 1) != 0;
      this = (Double *)((long)(local_68 + 1) >> bVar4);
    }
    else {
      uVar7 = local_68;
      if (uVar10 == uVar6) {
        uVar7 = local_68 + ((byte)(~bVar12 | (byte)local_68) & 1);
      }
      bVar4 = (local_48 & uVar7) != 0;
      pDVar13 = (Double *)((long)uVar7 >> bVar4);
      this = pDVar13;
    }
    uVar6 = iVar14 + (uint)bVar4;
    *result_is_junk = false;
    if (!parse_as_hex_float) {
      cVar15 = (char)local_a0;
      goto LAB_004b4490;
    }
    local_70 = this;
    Advance<unsigned_short_const*>(current,separator,0x10,&local_a8);
    bVar4 = false;
    cVar15 = (char)local_a0;
    bVar5 = false;
    if (**current == 0x2b) {
LAB_004b440c:
      bVar4 = bVar5;
      Advance<unsigned_short_const*>(current,separator,0x10,&local_a8);
    }
    else if (**current == 0x2d) {
      bVar5 = true;
      goto LAB_004b440c;
    }
    uVar10 = 0;
    do {
      uVar11 = **current - 0x30;
      pDVar13 = (Double *)(ulong)uVar11;
      if (9 < uVar11) break;
      uVar11 = -uVar10;
      if (0 < (int)uVar10) {
        uVar11 = uVar10;
      }
      uVar3 = (**current - 0x30) + uVar10 * 10;
      if (0x17bb0 < uVar11) {
        uVar3 = uVar10;
      }
      uVar10 = uVar3;
      bVar5 = Advance<unsigned_short_const*>(current,separator,0x10,&local_a8);
      pDVar13 = extraout_RDX;
    } while (!bVar5);
    uVar11 = -uVar10;
    if (!bVar4) {
      uVar11 = uVar10;
    }
    uVar6 = uVar11 + uVar6;
    this = local_70;
LAB_004b4490:
    if ((uVar6 != 0) && (this != (Double *)0x0)) {
      diy_fp.f_ = (ulong)uVar6;
      diy_fp._8_8_ = pDVar13;
      dVar17 = (double)Double::DiyFpToUint64(this,diy_fp);
      if (cVar15 != '\0') {
        return (double)((ulong)dVar17 ^ (ulong)DAT_02f6a4e0);
      }
      return dVar17;
    }
    if (cVar15 != '\0') {
      if (this == (Double *)0x0) {
        return -0.0;
      }
      this = (Double *)-(long)this;
    }
    return (double)(long)this;
  }
  if (parse_as_hex_float) {
    if (uVar1 == 0x2e) {
      Advance<unsigned_short_const*>(current,separator,0x10,&local_a8);
      local_78 = CONCAT71(extraout_var_00,1);
      dVar17 = (double)(*(code *)(&DAT_02f6a5c0 + *(int *)(&DAT_02f6a5c0 + local_40 * 4)))();
      return dVar17;
    }
    if ((!parse_as_hex_float) || ((uVar1 | 0x20) != 0x70)) goto LAB_004b4325;
  }
  else {
LAB_004b4325:
    if ((char)local_9c == '\0') {
      bVar4 = puVar16 != local_80;
      if ((bVar4) && (bVar5 = isWhitespace((uint)*puVar16), bVar5)) {
        do {
          puVar16 = puVar16 + 1;
          bVar4 = puVar16 != local_80;
          if (puVar16 == local_80) break;
          bVar5 = isWhitespace((uint)*puVar16);
        } while (bVar5);
        *local_58 = puVar16;
      }
      uVar6 = 5;
      if (bVar4) {
        return local_98;
      }
      goto LAB_004b4275;
    }
  }
  uVar6 = 5;
LAB_004b4275:
  dVar17 = (double)(*(code *)(&DAT_02f6a5c0 + *(int *)(&DAT_02f6a5c0 + (ulong)uVar6 * 4)))();
  return dVar17;
}

Assistant:

static double RadixStringToIeee(Iterator* current,
                                Iterator end,
                                bool sign,
                                uc16 separator,
                                bool parse_as_hex_float,
                                bool allow_trailing_junk,
                                double junk_string_value,
                                bool read_as_double,
                                bool* result_is_junk) {
  DOUBLE_CONVERSION_ASSERT(*current != end);
  DOUBLE_CONVERSION_ASSERT(!parse_as_hex_float ||
      IsHexFloatString(*current, end, separator, allow_trailing_junk));

  const int kDoubleSize = Double::kSignificandSize;
  const int kSingleSize = Single::kSignificandSize;
  const int kSignificandSize = read_as_double? kDoubleSize: kSingleSize;

  *result_is_junk = true;

  int64_t number = 0;
  int exponent = 0;
  const int radix = (1 << radix_log_2);
  // Whether we have encountered a '.' and are parsing the decimal digits.
  // Only relevant if parse_as_hex_float is true.
  bool post_decimal = false;

  // Skip leading 0s.
  while (**current == '0') {
    if (Advance(current, separator, radix, end)) {
      *result_is_junk = false;
      return SignedZero(sign);
    }
  }

  while (true) {
    int digit;
    if (IsDecimalDigitForRadix(**current, radix)) {
      digit = static_cast<char>(**current) - '0';
      if (post_decimal) exponent -= radix_log_2;
    } else if (IsCharacterDigitForRadix(**current, radix, 'a')) {
      digit = static_cast<char>(**current) - 'a' + 10;
      if (post_decimal) exponent -= radix_log_2;
    } else if (IsCharacterDigitForRadix(**current, radix, 'A')) {
      digit = static_cast<char>(**current) - 'A' + 10;
      if (post_decimal) exponent -= radix_log_2;
    } else if (parse_as_hex_float && **current == '.') {
      post_decimal = true;
      Advance(current, separator, radix, end);
      DOUBLE_CONVERSION_ASSERT(*current != end);
      continue;
    } else if (parse_as_hex_float && (**current == 'p' || **current == 'P')) {
      break;
    } else {
      if (allow_trailing_junk || !AdvanceToNonspace(current, end)) {
        break;
      } else {
        return junk_string_value;
      }
    }

    number = number * radix + digit;
    int overflow = static_cast<int>(number >> kSignificandSize);
    if (overflow != 0) {
      // Overflow occurred. Need to determine which direction to round the
      // result.
      int overflow_bits_count = 1;
      while (overflow > 1) {
        overflow_bits_count++;
        overflow >>= 1;
      }

      int dropped_bits_mask = ((1 << overflow_bits_count) - 1);
      int dropped_bits = static_cast<int>(number) & dropped_bits_mask;
      number >>= overflow_bits_count;
      exponent += overflow_bits_count;

      bool zero_tail = true;
      for (;;) {
        if (Advance(current, separator, radix, end)) break;
        if (parse_as_hex_float && **current == '.') {
          // Just run over the '.'. We are just trying to see whether there is
          // a non-zero digit somewhere.
          Advance(current, separator, radix, end);
          DOUBLE_CONVERSION_ASSERT(*current != end);
          post_decimal = true;
        }
        if (!isDigit(**current, radix)) break;
        zero_tail = zero_tail && **current == '0';
        if (!post_decimal) exponent += radix_log_2;
      }

      if (!parse_as_hex_float &&
          !allow_trailing_junk &&
          AdvanceToNonspace(current, end)) {
        return junk_string_value;
      }

      int middle_value = (1 << (overflow_bits_count - 1));
      if (dropped_bits > middle_value) {
        number++;  // Rounding up.
      } else if (dropped_bits == middle_value) {
        // Rounding to even to consistency with decimals: half-way case rounds
        // up if significant part is odd and down otherwise.
        if ((number & 1) != 0 || !zero_tail) {
          number++;  // Rounding up.
        }
      }

      // Rounding up may cause overflow.
      if ((number & ((int64_t)1 << kSignificandSize)) != 0) {
        exponent++;
        number >>= 1;
      }
      break;
    }
    if (Advance(current, separator, radix, end)) break;
  }

  DOUBLE_CONVERSION_ASSERT(number < ((int64_t)1 << kSignificandSize));
  DOUBLE_CONVERSION_ASSERT(static_cast<int64_t>(static_cast<double>(number)) == number);

  *result_is_junk = false;

  if (parse_as_hex_float) {
    DOUBLE_CONVERSION_ASSERT(**current == 'p' || **current == 'P');
    Advance(current, separator, radix, end);
    DOUBLE_CONVERSION_ASSERT(*current != end);
    bool is_negative = false;
    if (**current == '+') {
      Advance(current, separator, radix, end);
      DOUBLE_CONVERSION_ASSERT(*current != end);
    } else if (**current == '-') {
      is_negative = true;
      Advance(current, separator, radix, end);
      DOUBLE_CONVERSION_ASSERT(*current != end);
    }
    int written_exponent = 0;
    while (IsDecimalDigitForRadix(**current, 10)) {
      // No need to read exponents if they are too big. That could potentially overflow
      // the `written_exponent` variable.
      if (abs(written_exponent) <= 100 * Double::kMaxExponent) {
        written_exponent = 10 * written_exponent + **current - '0';
      }
      if (Advance(current, separator, radix, end)) break;
    }
    if (is_negative) written_exponent = -written_exponent;
    exponent += written_exponent;
  }

  if (exponent == 0 || number == 0) {
    if (sign) {
      if (number == 0) return -0.0;
      number = -number;
    }
    return static_cast<double>(number);
  }

  DOUBLE_CONVERSION_ASSERT(number != 0);
  double result = Double(DiyFp(number, exponent)).value();
  return sign ? -result : result;
}